

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-wrap.cpp
# Opt level: O2

void __thiscall MyInfo::MyInfo(MyInfo *this)

{
  undefined8 uVar1;
  
  ASDCP::WriterInfo::WriterInfo(&this->super_WriterInfo);
  uVar1 = MyInfo::default_ProductUUID_Data._8_8_;
  *(undefined8 *)(this->super_WriterInfo).ProductUUID = MyInfo::default_ProductUUID_Data._0_8_;
  *(undefined8 *)((this->super_WriterInfo).ProductUUID + 8) = uVar1;
  std::__cxx11::string::assign((char *)&(this->super_WriterInfo).CompanyName);
  std::__cxx11::string::assign((char *)&(this->super_WriterInfo).ProductName);
  ASDCP::Version();
  std::__cxx11::string::assign((char *)&(this->super_WriterInfo).ProductVersion);
  return;
}

Assistant:

MyInfo()
  {
      static byte_t default_ProductUUID_Data[UUIDlen] =
      { 0x7d, 0x83, 0x6e, 0x16, 0x37, 0xc7, 0x4c, 0x22,
	0xb2, 0xe0, 0x46, 0xa7, 0x17, 0xe8, 0x4f, 0x42 };

      memcpy(ProductUUID, default_ProductUUID_Data, UUIDlen);
      CompanyName = "WidgetCo";
      ProductName = "asdcp-wrap";
      ProductVersion = ASDCP::Version();
  }